

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ct.cpp
# Opt level: O2

void UConverter_toUnicode_CompoundText_OFFSETS(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  undefined2 uVar2;
  byte *pbVar3;
  void *pvVar4;
  UChar *pUVar5;
  UConverter *pUVar6;
  UConverterSharedData *pUVar7;
  size_t sVar8;
  ushort uVar9;
  uint8_t *puVar10;
  char cVar11;
  uint8_t (*pauVar12) [5];
  int iVar13;
  long lVar14;
  uint8_t *puVar15;
  long lVar16;
  UChar *pUVar17;
  int32_t offset;
  long lVar18;
  UConverterToUnicodeArgs subArgs;
  
  puVar15 = (uint8_t *)args->source;
  pUVar17 = args->target;
  pbVar3 = (byte *)args->sourceLimit;
  pvVar4 = args->converter->extraInfo;
  uVar2 = args->size;
  uVar9 = 0x38;
  if ((ushort)uVar2 < 0x38) {
    uVar9 = uVar2;
  }
  memcpy(&subArgs,args,(ulong)uVar9);
  iVar13 = *(int *)((long)pvVar4 + 0xa0);
  subArgs.size = uVar9;
LAB_0016382f:
  do {
    pauVar12 = escSeqCompoundText;
    if (pbVar3 <= puVar15) goto LAB_00163a7a;
    pUVar5 = args->targetLimit;
    if (pUVar5 <= pUVar17) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_00163a7a;
    }
    pUVar6 = args->converter;
    cVar11 = pUVar6->toULength;
    lVar18 = (long)cVar11;
    puVar10 = puVar15;
    if (0 < lVar18) {
      puVar10 = pUVar6->toUBytes;
    }
    if (*puVar10 == 0x1b) {
      for (lVar14 = 0; lVar14 != 0x14; lVar14 = lVar14 + 1) {
        lVar16 = 0;
LAB_00163881:
        bVar1 = (*pauVar12)[lVar16];
        if (bVar1 == 0) {
          if (*err == U_TRUNCATED_CHAR_FOUND) goto LAB_00163a60;
          iVar13 = (int)lVar14;
          sVar8 = strlen((char *)(escSeqCompoundText + iVar13));
          puVar15 = puVar15 + ((int)sVar8 - (int)cVar11);
          pUVar6->toULength = '\0';
          goto LAB_00163913;
        }
        if (lVar16 < lVar18) {
          if (pUVar6->toUBytes[lVar16] != bVar1) goto LAB_001638b8;
LAB_001638a8:
          lVar16 = lVar16 + 1;
          goto LAB_00163881;
        }
        if (puVar15 + (lVar16 - lVar18) < pbVar3) {
          if ((int)(char)puVar15[lVar16 - lVar18] != (uint)bVar1) goto LAB_001638b8;
          goto LAB_001638a8;
        }
        *err = U_TRUNCATED_CHAR_FOUND;
LAB_001638b8:
        pauVar12 = pauVar12 + 1;
      }
      if (*err == U_TRUNCATED_CHAR_FOUND) {
LAB_00163a60:
        for (; puVar15 < pbVar3; puVar15 = puVar15 + 1) {
          bVar1 = *puVar15;
          pUVar6 = args->converter;
          cVar11 = pUVar6->toULength;
          pUVar6->toULength = cVar11 + '\x01';
          pUVar6->toUBytes[cVar11] = bVar1;
        }
        *err = U_ZERO_ERROR;
      }
      else {
        puVar15 = puVar15 + (cVar11 == '\0');
        *err = U_ILLEGAL_CHAR_FOUND;
      }
      goto LAB_00163a7a;
    }
LAB_00163913:
    if (iVar13 == 0) {
      while( true ) {
        if ((pbVar3 <= puVar15) || (bVar1 = *puVar15, (ushort)bVar1 == L'\x1b')) goto LAB_0016382f;
        if (pUVar5 <= pUVar17) break;
        puVar15 = puVar15 + 1;
        *pUVar17 = (ushort)bVar1;
        pUVar17 = pUVar17 + 1;
      }
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_0016382f;
    }
    if (puVar15 < pbVar3) {
      lVar14 = (long)((int)pbVar3 - (int)puVar15);
      for (lVar18 = 1;
          (lVar16 = lVar14, lVar18 < lVar14 && (lVar16 = lVar18, puVar15[lVar18] != 0x1b));
          lVar18 = lVar18 + 1) {
      }
      subArgs.sourceLimit = (char *)(puVar15 + lVar16);
      pUVar7 = (subArgs.converter)->sharedData;
      (subArgs.converter)->sharedData = *(UConverterSharedData **)((long)pvVar4 + (long)iVar13 * 8);
      subArgs.source = (char *)puVar15;
      subArgs.target = pUVar17;
      ucnv_MBCSToUnicodeWithOffsets_63(&subArgs,err);
      pUVar17 = subArgs.target;
      puVar15 = (uint8_t *)subArgs.source;
      (subArgs.converter)->sharedData = pUVar7;
      if (U_ZERO_ERROR < *err) {
        if (*err == U_BUFFER_OVERFLOW_ERROR) {
          cVar11 = (subArgs.converter)->UCharErrorBufferLength;
          if (0 < (long)cVar11) {
            memcpy(args->converter->UCharErrorBuffer,(subArgs.converter)->UCharErrorBuffer,
                   (long)cVar11);
            cVar11 = (subArgs.converter)->UCharErrorBufferLength;
          }
          args->converter->UCharErrorBufferLength = cVar11;
          (subArgs.converter)->UCharErrorBufferLength = '\0';
        }
LAB_00163a7a:
        *(int *)((long)pvVar4 + 0xa0) = iVar13;
        args->target = pUVar17;
        args->source = (char *)puVar15;
        return;
      }
    }
  } while( true );
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_CompoundText_OFFSETS(UConverterToUnicodeArgs *args,
                                               UErrorCode* err){
    const char *mySource = (char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    const char *tmpSourceLimit = mySourceLimit;
    uint32_t mySourceChar = 0x0000;
    COMPOUND_TEXT_CONVERTERS currentState, tmpState;
    int32_t sourceOffset = 0;
    UConverterDataCompoundText *myConverterData = (UConverterDataCompoundText *) args->converter->extraInfo;
    UConverterSharedData* savedSharedData = NULL;

    UConverterToUnicodeArgs subArgs;
    int32_t minArgsSize;

    /* set up the subconverter arguments */
    if(args->size<sizeof(UConverterToUnicodeArgs)) {
        minArgsSize = args->size;
    } else {
        minArgsSize = (int32_t)sizeof(UConverterToUnicodeArgs);
    }

    uprv_memcpy(&subArgs, args, minArgsSize);
    subArgs.size = (uint16_t)minArgsSize;

    currentState = tmpState =  myConverterData->state;

    while(mySource < mySourceLimit){
        if(myTarget < args->targetLimit){
            if (args->converter->toULength > 0) {
                mySourceChar = args->converter->toUBytes[0];
            } else {
                mySourceChar = (uint8_t)*mySource;
            }

            if (mySourceChar == ESC_START) {
                tmpState = findStateFromEscSeq(mySource, mySourceLimit, args->converter->toUBytes, args->converter->toULength, err);

                if (*err == U_TRUNCATED_CHAR_FOUND) {
                    for (; mySource < mySourceLimit;) {
                        args->converter->toUBytes[args->converter->toULength++] = *mySource++;
                    }
                    *err = U_ZERO_ERROR;
                    break;
                } else if (tmpState == INVALID) {
                    if (args->converter->toULength == 0) {
                        mySource++; /* skip over the 0x1b byte */
                    }
                    *err = U_ILLEGAL_CHAR_FOUND;
                    break;
                }

                if (tmpState != currentState) {
                    currentState = tmpState;
                }

                sourceOffset = static_cast<int32_t>(uprv_strlen((char*)escSeqCompoundText[currentState]) - args->converter->toULength);

                mySource += sourceOffset;

                args->converter->toULength = 0;
            }

            if (currentState == COMPOUND_TEXT_SINGLE_0) {
                while (mySource < mySourceLimit) {
                    if (*mySource == ESC_START) {
                        break;
                    }
                    if (myTarget < args->targetLimit) {
                        *myTarget++ = 0x00ff&(*mySource++);
                    } else {
                        *err = U_BUFFER_OVERFLOW_ERROR;
                        break;
                    }
                }
            } else if (mySource < mySourceLimit){
                sourceOffset = findNextEsc(mySource, mySourceLimit);

                tmpSourceLimit = mySource + sourceOffset;

                subArgs.source = mySource;
                subArgs.sourceLimit = tmpSourceLimit;
                subArgs.target = myTarget;
                savedSharedData = subArgs.converter->sharedData;
                subArgs.converter->sharedData = myConverterData->myConverterArray[currentState];

                ucnv_MBCSToUnicodeWithOffsets(&subArgs, err);

                subArgs.converter->sharedData = savedSharedData;

                mySource = subArgs.source;
                myTarget = subArgs.target;

                if (U_FAILURE(*err)) {
                    if(*err == U_BUFFER_OVERFLOW_ERROR) {
                        if(subArgs.converter->UCharErrorBufferLength > 0) {
                            uprv_memcpy(args->converter->UCharErrorBuffer, subArgs.converter->UCharErrorBuffer,
                                        subArgs.converter->UCharErrorBufferLength);
                        }
                        args->converter->UCharErrorBufferLength=subArgs.converter->UCharErrorBufferLength;
                        subArgs.converter->UCharErrorBufferLength = 0;
                    }
                    break;
                }
            }
        } else {
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
    myConverterData->state = currentState;
    args->target = myTarget;
    args->source = mySource;
}